

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O3

int Abc_ObjExpandCubesTry(Vec_Str_t *vSop,sat_solver *pSat,Vec_Int_t *vVars)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t __size;
  int iVar5;
  uint uVar6;
  Vec_Int_t *vLits;
  int *piVar7;
  Vec_Int_t *vTemp;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  char *pSop;
  
  pSop = vSop->pArray;
  iVar5 = Abc_SopGetCubeNum(pSop);
  uVar6 = Abc_SopGetVarNum(pSop);
  vLits = (Vec_Int_t *)malloc(0x10);
  uVar10 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar10 = uVar6;
  }
  vLits->nSize = 0;
  vLits->nCap = uVar10;
  if (uVar10 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)(int)uVar10 * 4);
  }
  vLits->pArray = piVar7;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nSize = 0;
  vTemp->nCap = uVar10;
  if (uVar10 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)(int)uVar10 << 2);
  }
  vTemp->pArray = piVar8;
  if (uVar6 != vVars->nSize) {
    __assert_fail("nVars == Vec_IntSize(vVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x40,"int Abc_ObjExpandCubesTry(Vec_Str_t *, sat_solver *, Vec_Int_t *)");
  }
  lVar1 = (long)(int)uVar6 + 3;
  if (vSop->nSize != (int)lVar1 * iVar5 + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                  ,0x41,"int Abc_ObjExpandCubesTry(Vec_Str_t *, sat_solver *, Vec_Int_t *)");
  }
  if (*pSop != '\0') {
    __size = (long)(int)uVar6 << 2;
    do {
      if (vLits->nCap < (int)uVar6) {
        if (vLits->pArray == (int *)0x0) {
          piVar7 = (int *)malloc(__size);
        }
        else {
          piVar7 = (int *)realloc(vLits->pArray,__size);
        }
        vLits->pArray = piVar7;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vLits->nCap = uVar6;
      }
      if ((int)uVar6 < 1) {
        vLits->nSize = uVar6;
      }
      else {
        memset(vLits->pArray,0xff,(ulong)uVar6 * 4);
        vLits->nSize = uVar6;
        uVar9 = 0;
        do {
          if (pSop[uVar9] != '-') {
            if ((long)vVars->nSize <= (long)uVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vVars->pArray[uVar9] < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf1,"int Abc_Var2Lit(int, int)");
            }
            if ((long)vLits->nSize <= (long)uVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            vLits->pArray[uVar9] = (uint)(pSop[uVar9] == '0') + vVars->pArray[uVar9] * 2;
            pSop[uVar9] = '-';
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      Bmc_CollapseExpandRound(pSat,(sat_solver *)0x0,vLits,(Vec_Int_t *)0x0,vTemp,0,0,-1);
      iVar3 = vLits->nSize;
      if (0 < (long)iVar3) {
        piVar7 = vLits->pArray;
        uVar9 = 0;
        do {
          iVar4 = piVar7[uVar9];
          if (iVar4 != -1) {
            if (iVar4 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf3,"int Abc_LitIsCompl(int)");
            }
            pSop[uVar9] = (byte)iVar4 & 1 ^ 0x31;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)(long)iVar3);
      }
      pcVar2 = pSop + lVar1;
      pSop = pSop + lVar1;
    } while (*pcVar2 != '\0');
    piVar7 = vLits->pArray;
  }
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  free(vLits);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  return iVar5;
}

Assistant:

int Abc_ObjExpandCubesTry( Vec_Str_t * vSop, sat_solver * pSat, Vec_Int_t * vVars )
{
    extern int Bmc_CollapseExpandRound( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit );

    char * pCube, * pSop = Vec_StrArray(vSop);
    int nCubes = Abc_SopGetCubeNum(pSop);
    int nVars = Abc_SopGetVarNum(pSop);

    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vTemp = Vec_IntAlloc( nVars );

    assert( nVars == Vec_IntSize(vVars) );
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
    {
        int k, Entry;
        // collect literals and clean cube
        Vec_IntFill( vLits, nVars, -1 );
        for ( k = 0; k < nVars; k++ )
        {
            if ( pCube[k] == '-' )
                continue;
            Vec_IntWriteEntry( vLits, k, Abc_Var2Lit(Vec_IntEntry(vVars, k), pCube[k] == '0') );
            pCube[k] = '-';
        }
        // expand cube
        Bmc_CollapseExpandRound( pSat, NULL, vLits, NULL, vTemp, 0, 0, -1 );
        // insert literals
        Vec_IntForEachEntry( vLits, Entry, k )
            if ( Entry != -1 )
                pCube[k] = '1' - Abc_LitIsCompl(Entry);
    }

    Vec_IntFree( vLits );
    Vec_IntFree( vTemp );
    return nCubes;
}